

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QStringList * QFontDatabase::styles(QString *family)

{
  QtFontFoundry *pQVar1;
  bool bVar2;
  int iVar3;
  QFontDatabasePrivate *this;
  QtFontFamily *this_00;
  QString *in_RSI;
  QFontDatabasePrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int k;
  QtFontFoundry *foundry;
  int j;
  QtFontFamily *f;
  QFontDatabasePrivate *d;
  QStringList *l;
  QtFontFoundry allStyles;
  QString foundryName;
  QString familyName;
  Key ke;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff18;
  QFontDatabasePrivate *this_01;
  Style style;
  int in_stack_ffffffffffffff34;
  int local_c0;
  undefined4 in_stack_ffffffffffffff44;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar4;
  byte bVar5;
  QString *in_stack_ffffffffffffff58;
  QFontDatabasePrivate *this_02;
  qsizetype in_stack_ffffffffffffff88;
  int local_60;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  Key local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  this_02 = in_RDI;
  QString::QString((QString *)0x741d4d);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x741d87);
  parseFontName(in_RSI,in_stack_ffffffffffffff58,
                (QString *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)in_stack_ffffffffffffff18);
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)this_01,in_stack_ffffffffffffff18);
  this = QFontDatabasePrivate::ensureFontDatabase();
  uVar4 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->families = (QtFontFamily **)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->populated = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x741e14);
  this_00 = QFontDatabasePrivate::family(this_02,in_RSI,(FamilyRequestFlags)((ulong)this >> 0x20));
  if (this_00 == (QtFontFamily *)0x0) {
    bVar5 = 1;
  }
  else {
    memset(&stack0xffffffffffffff88,0xaa,0x28);
    QtFontFoundry::QtFontFoundry((QtFontFoundry *)this_01,(QString *)in_stack_ffffffffffffff18);
    for (local_c0 = 0; local_c0 < this_00->count; local_c0 = local_c0 + 1) {
      pQVar1 = this_00->foundries[local_c0];
      bVar2 = QString::isEmpty((QString *)0x741eae);
      if ((bVar2) ||
         (iVar3 = QString::compare((QString *)pQVar1,(CaseSensitivity)&local_50), iVar3 == 0)) {
        for (in_stack_ffffffffffffff34 = 0; in_stack_ffffffffffffff34 < pQVar1->count;
            in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + 1) {
          local_1c = (Key)0xaaaaaaaa;
          QtFontStyle::Key::Key(&local_1c,&pQVar1->styles[in_stack_ffffffffffffff34]->key);
          local_1c = (Key)((uint)local_1c & 0xffff0fff);
          local_1c._2_1_ = 0;
          QtFontFoundry::style
                    ((QtFontFoundry *)this,(Key *)CONCAT17(uVar4,in_stack_ffffffffffffff50),
                     (QString *)this_00,SUB41((uint)in_stack_ffffffffffffff44 >> 0x18,0));
        }
      }
    }
    QList<QString>::reserve((QList<QString> *)this_00,in_stack_ffffffffffffff88);
    for (style = StyleNormal; (int)style < local_60; style = style + StyleItalic) {
      bVar2 = QString::isEmpty((QString *)0x741fc6);
      if (bVar2) {
        styleStringHelper(in_stack_ffffffffffffff34,style);
      }
      else {
        QString::QString((QString *)this_01,(QString *)in_stack_ffffffffffffff18);
      }
      QList<QString>::append((QList<QString> *)this_01,(rvalue_ref)in_stack_ffffffffffffff18);
      QString::~QString((QString *)0x742032);
    }
    bVar5 = 1;
    QtFontFoundry::~QtFontFoundry((QtFontFoundry *)this_01);
  }
  if ((bVar5 & 1) == 0) {
    QList<QString>::~QList((QList<QString> *)0x74206a);
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)this_01);
  QString::~QString((QString *)0x742084);
  QString::~QString((QString *)0x742091);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QStringList *)this_01;
}

Assistant:

QStringList QFontDatabase::styles(const QString &family)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QStringList l;
    QtFontFamily *f = d->family(familyName);
    if (!f)
        return l;

    QtFontFoundry allStyles(foundryName);
    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++) {
                QtFontStyle::Key ke(foundry->styles[k]->key);
                ke.stretch = 0;
                allStyles.style(ke, foundry->styles[k]->styleName, true);
            }
        }
    }

    l.reserve(allStyles.count);
    for (int i = 0; i < allStyles.count; i++) {
        l.append(allStyles.styles[i]->styleName.isEmpty() ?
                 styleStringHelper(allStyles.styles[i]->key.weight,
                                   (QFont::Style)allStyles.styles[i]->key.style) :
                 allStyles.styles[i]->styleName);
    }
    return l;
}